

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::EmbeddingLayerParams::SharedCtor(EmbeddingLayerParams *this)

{
  this->inputdim_ = 0;
  this->outputchannels_ = 0;
  this->weights_ = (WeightParams *)0x0;
  this->bias_ = (WeightParams *)0x0;
  this->hasbias_ = false;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void EmbeddingLayerParams::SharedCtor() {
  ::memset(&weights_, 0, reinterpret_cast<char*>(&hasbias_) -
    reinterpret_cast<char*>(&weights_) + sizeof(hasbias_));
  _cached_size_ = 0;
}